

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

void rgbcx::precise_round_565
               (vec3F *xl,vec3F *xh,int *trial_lr,int *trial_lg,int *trial_lb,int *trial_hr,
               int *trial_hg,int *trial_hb)

{
  uint uVar1;
  uint uVar2;
  
  *trial_lr = (int)(xl->c[0] * 31.0);
  *trial_lg = (int)(xl->c[1] * 63.0);
  *trial_lb = (int)(xl->c[2] * 31.0);
  *trial_hr = (int)(xh->c[0] * 31.0);
  *trial_hg = (int)(xh->c[1] * 63.0);
  uVar2 = (uint)(xh->c[2] * 31.0);
  *trial_hb = uVar2;
  uVar1 = *trial_lr;
  if (0x1f < (*trial_lb | *trial_hr | uVar1 | uVar2)) {
    uVar2 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = uVar2;
    }
    if (0x1e < (int)uVar1) {
      uVar1 = 0x1f;
    }
    *trial_lr = uVar1;
    uVar1 = *trial_hr;
    if (*trial_hr < 1) {
      uVar1 = uVar2;
    }
    if (0x1e < (int)uVar1) {
      uVar1 = 0x1f;
    }
    *trial_hr = uVar1;
    uVar1 = *trial_lb;
    if (*trial_lb < 1) {
      uVar1 = uVar2;
    }
    if (0x1e < (int)uVar1) {
      uVar1 = 0x1f;
    }
    *trial_lb = uVar1;
    if (0 < *trial_hb) {
      uVar2 = *trial_hb;
    }
    if (0x1e < (int)uVar2) {
      uVar2 = 0x1f;
    }
    *trial_hb = uVar2;
  }
  uVar1 = *trial_lg;
  if (0x3f < (*trial_hg | uVar1)) {
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    if (0x3e < (int)uVar1) {
      uVar1 = 0x3f;
    }
    *trial_lg = uVar1;
    uVar1 = 0;
    if (0 < *trial_hg) {
      uVar1 = *trial_hg;
    }
    if (0x3e < (int)uVar1) {
      uVar1 = 0x3f;
    }
    *trial_hg = uVar1;
  }
  *trial_lr = (uint)(*(float *)(g_midpoint5 + (long)*trial_lr * 4) <= xl->c[0] &&
                    xl->c[0] != *(float *)(g_midpoint5 + (long)*trial_lr * 4)) + *trial_lr & 0x1f;
  *trial_lg = (uint)(*(float *)(g_midpoint6 + (long)*trial_lg * 4) <= xl->c[1] &&
                    xl->c[1] != *(float *)(g_midpoint6 + (long)*trial_lg * 4)) + *trial_lg & 0x3f;
  *trial_lb = (uint)(*(float *)(g_midpoint5 + (long)*trial_lb * 4) <= xl->c[2] &&
                    xl->c[2] != *(float *)(g_midpoint5 + (long)*trial_lb * 4)) + *trial_lb & 0x1f;
  *trial_hr = (uint)(*(float *)(g_midpoint5 + (long)*trial_hr * 4) <= xh->c[0] &&
                    xh->c[0] != *(float *)(g_midpoint5 + (long)*trial_hr * 4)) + *trial_hr & 0x1f;
  *trial_hg = (uint)(*(float *)(g_midpoint6 + (long)*trial_hg * 4) <= xh->c[1] &&
                    xh->c[1] != *(float *)(g_midpoint6 + (long)*trial_hg * 4)) + *trial_hg & 0x3f;
  *trial_hb = (uint)(*(float *)(g_midpoint5 + (long)*trial_hb * 4) <= xh->c[2] &&
                    xh->c[2] != *(float *)(g_midpoint5 + (long)*trial_hb * 4)) + *trial_hb & 0x1f;
  return;
}

Assistant:

static inline void precise_round_565(const vec3F &xl, const vec3F &xh, 
		int &trial_lr, int &trial_lg, int &trial_lb,
		int &trial_hr, int &trial_hg, int &trial_hb)
	{
		trial_lr = (int)(xl.c[0] * 31.0f); 
		trial_lg = (int)(xl.c[1] * 63.0f); 
		trial_lb = (int)(xl.c[2] * 31.0f); 

		trial_hr = (int)(xh.c[0] * 31.0f); 
		trial_hg = (int)(xh.c[1] * 63.0f); 
		trial_hb = (int)(xh.c[2] * 31.0f); 

		if ((uint32_t)(trial_lr | trial_lb | trial_hr | trial_hb) > 31U)
		{
			trial_lr = ((uint32_t)trial_lr > 31U) ? (~trial_lr >> 31) & 31 : trial_lr;
			trial_hr = ((uint32_t)trial_hr > 31U) ? (~trial_hr >> 31) & 31 : trial_hr;

			trial_lb = ((uint32_t)trial_lb > 31U) ? (~trial_lb >> 31) & 31 : trial_lb;
			trial_hb = ((uint32_t)trial_hb > 31U) ? (~trial_hb >> 31) & 31 : trial_hb;
		}

		if ((uint32_t)(trial_lg | trial_hg) > 63U)
		{
			trial_lg = ((uint32_t)trial_lg > 63U) ? (~trial_lg >> 31) & 63 : trial_lg;
			trial_hg = ((uint32_t)trial_hg > 63U) ? (~trial_hg >> 31) & 63 : trial_hg;
		}

		trial_lr = (trial_lr + (xl.c[0] > g_midpoint5[trial_lr])) & 31;
		trial_lg = (trial_lg + (xl.c[1] > g_midpoint6[trial_lg])) & 63;
		trial_lb = (trial_lb + (xl.c[2] > g_midpoint5[trial_lb])) & 31;
				
		trial_hr = (trial_hr + (xh.c[0] > g_midpoint5[trial_hr])) & 31;
		trial_hg = (trial_hg + (xh.c[1] > g_midpoint6[trial_hg])) & 63;
		trial_hb = (trial_hb + (xh.c[2] > g_midpoint5[trial_hb])) & 31;
	}